

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  allocator<double> *this;
  initializer_list<double> __l;
  bool bVar1;
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pEVar2;
  ostream *poVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  uchar *puVar4;
  size_type sVar5;
  reference pdVar6;
  encode_state eVar7;
  decode_state dVar8;
  string *local_620;
  string *local_520;
  double *it_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<double,_std::allocator<double>_> *__range1_2;
  size_t local_478;
  undefined1 local_470 [8];
  vector<double,_std::allocator<double>_> dout5;
  undefined1 local_448 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> out5;
  double local_428 [4];
  iterator local_408;
  size_type local_400;
  undefined1 local_3f8 [8];
  vector<double,_std::allocator<double>_> buf2;
  undefined1 local_3d0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> dout4;
  undefined1 local_3a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dout3;
  undefined1 local_378 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> out4;
  undefined1 local_350 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> out3;
  undefined1 local_318 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf1;
  string local_2f8 [8];
  string buf0;
  undefined1 local_2b8 [8];
  string c;
  char *it;
  iterator __end1_1;
  iterator __begin1_1;
  string *__range1_1;
  Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> d2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string *local_200;
  string *word;
  string *__end1;
  string *__begin1;
  string (*__range1) [4];
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> e2;
  string out2;
  undefined1 local_198 [8];
  string words [4];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  undefined1 local_f8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  string local_d8 [8];
  string buf;
  Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> d1;
  string dout1;
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> e1;
  string out1;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string brand;
  
  brand.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"YukiWorkshop",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::string((string *)&e1.output_target);
  YukiWorkshop::Base64X::
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Encoder
            ((Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&dout1.field_2 + 8));
  YukiWorkshop::Base64X::operator>>
            ((Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&dout1.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e1.output_target)
  ;
  pEVar2 = YukiWorkshop::Base64X::operator<<
                     ((Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)&dout1.field_2 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30)
  ;
  pEVar2 = YukiWorkshop::Base64X::operator<<(pEVar2," ");
  pEVar2 = YukiWorkshop::Base64X::operator<<(pEVar2,"Rocks!");
  YukiWorkshop::Base64X::operator<<(pEVar2,(char *)0x0);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&e1.output_target);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::string((string *)&d1.output_target);
  YukiWorkshop::Base64X::
  Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Decoder
            ((Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&buf.field_2 + 8));
  YukiWorkshop::Base64X::operator>>
            ((Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&buf.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d1.output_target)
  ;
  YukiWorkshop::Base64X::operator<<
            ((Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&buf.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e1.output_target)
  ;
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&d1.output_target);
  std::operator<<(poVar3,"\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"Austin!",
             (allocator<char> *)
             ((long)&v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_100._M_current = (char *)std::__cxx11::string::begin();
  local_108._M_current = (char *)std::__cxx11::string::end();
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)&stack0xfffffffffffffef7);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_f8,local_100,local_108,
             (allocator<unsigned_char> *)&stack0xfffffffffffffef7);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)&stack0xfffffffffffffef7);
  out2.field_2._M_local_buf[0xc] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"Hey ",(allocator<char> *)(out2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(words[0].field_2._M_local_buf + 8),"guys, ",
             (allocator<char> *)(out2.field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(words[1].field_2._M_local_buf + 8),"this is ",
             (allocator<char> *)(out2.field_2._M_local_buf + 0xd));
  local_520 = (string *)(words[2].field_2._M_local_buf + 8);
  do {
    std::__cxx11::string::string(local_520);
    local_520 = local_520 + 0x20;
  } while (local_520 != (string *)((long)&words[3].field_2 + 8));
  out2.field_2._M_local_buf[0xc] = '\0';
  std::allocator<char>::~allocator((allocator<char> *)(out2.field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator((allocator<char> *)(out2.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(out2.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&e2.output_target);
  YukiWorkshop::Base64X::
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Encoder
            ((Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&__range1);
  word = (string *)((long)&words[3].field_2 + 8);
  __end1 = (string *)local_198;
  __begin1 = __end1;
  for (; __end1 != word; __end1 = __end1 + 1) {
    local_200 = __end1;
    YukiWorkshop::Base64X::Encoder<std::__cxx11::string>::encode<std::__cxx11::string>
              (&local_220,&__range1,__end1);
    std::__cxx11::string::operator+=((string *)&e2.output_target,(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  YukiWorkshop::Base64X::Encoder<std::__cxx11::string>::
  encode<unsigned_char,std::allocator<unsigned_char>>
            (&local_240,&__range1,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8)
  ;
  std::__cxx11::string::operator+=((string *)&e2.output_target,(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  YukiWorkshop::Base64X::
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  finalize((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d2.output_target,
           (Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&__range1);
  std::__cxx11::string::operator+=((string *)&e2.output_target,(string *)&d2.output_target);
  std::__cxx11::string::~string((string *)&d2.output_target);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&e2.output_target);
  std::operator<<(poVar3,"\n");
  YukiWorkshop::Base64X::
  Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Decoder
            ((Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&__range1_1);
  __end1_1._M_current = (char *)std::__cxx11::string::begin();
  it = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&it);
    if (!bVar1) break;
    c.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1_1);
    std::__cxx11::string::string((string *)local_2b8);
    std::__cxx11::string::push_back((char)(string *)local_2b8);
    YukiWorkshop::Base64X::Decoder<std::__cxx11::string>::decode<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&buf0.field_2 + 8),&__range1_1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
    std::operator<<((ostream *)&std::cout,(string *)(buf0.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(buf0.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_2b8);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f8,"roses are red",
             (allocator<char> *)
             ((long)&buf1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&buf1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)(out3.field_2._M_local_buf + 0xf));
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_318,__first,__last,
             (allocator<unsigned_char> *)(out3.field_2._M_local_buf + 0xf));
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)(out3.field_2._M_local_buf + 0xf));
  eVar7 = YukiWorkshop::Base64X::encode<unsigned_char,std::allocator<unsigned_char>>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_318);
  out4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)eVar7.buf_;
  YukiWorkshop::Base64X::encode_state::as<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350,
             (encode_state *)
             &out4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_350);
  std::operator<<(poVar3,"\n");
  eVar7 = YukiWorkshop::Base64X::encode("violets are blue");
  dout3.field_2._8_8_ = eVar7.buf_;
  YukiWorkshop::Base64X::encode_state::as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_378,
             (encode_state *)((long)&dout3.field_2 + 8));
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_378);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_378);
  fwrite(puVar4,1,sVar5,_stdout);
  fputc(10,_stdout);
  dVar8 = YukiWorkshop::Base64X::decode<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350)
  ;
  dout4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)dVar8.buf_;
  YukiWorkshop::Base64X::decode_state::as<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
             (decode_state *)
             &dout4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_3a8);
  std::operator<<(poVar3,"\n");
  dVar8 = YukiWorkshop::Base64X::decode<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_378);
  buf2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)dVar8.buf_;
  YukiWorkshop::Base64X::decode_state::as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3d0,
             (decode_state *)
             &buf2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3d0);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3d0);
  fwrite(puVar4,1,sVar5,_stdout);
  fputc(10,_stdout);
  local_428[2] = 233.233;
  local_428[3] = 666.666;
  local_428[0] = 3.14159265357;
  local_428[1] = 42.42;
  local_408 = local_428;
  local_400 = 4;
  this = (allocator<double> *)
         ((long)&out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this);
  __l._M_len = local_400;
  __l._M_array = local_408;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_3f8,__l,this);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  eVar7 = YukiWorkshop::Base64X::encode<double,std::allocator<double>>
                    ((vector<double,_std::allocator<double>_> *)local_3f8);
  dout5.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)eVar7.buf_;
  YukiWorkshop::Base64X::encode_state::as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_448,
             (encode_state *)
             &dout5.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_448);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_448);
  fwrite(puVar4,1,sVar5,_stdout);
  fputc(10,_stdout);
  dVar8 = YukiWorkshop::Base64X::decode<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_448);
  local_478 = dVar8.len_;
  __range1_2 = (vector<double,_std::allocator<double>_> *)dVar8.buf_;
  YukiWorkshop::Base64X::decode_state::as_vector<double,std::allocator<double>>
            ((vector<double,_std::allocator<double>_> *)local_470,(decode_state *)&__range1_2);
  __end1_2 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)local_470);
  it_1 = (double *)
         std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)local_470);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&it_1);
    if (!bVar1) break;
    pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1_2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pdVar6);
    std::operator<<(poVar3," ");
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_2);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_470);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_448);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_3f8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3d0);
  std::__cxx11::string::~string((string *)local_3a8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_378);
  std::__cxx11::string::~string((string *)local_350);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_318);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string((string *)&e2.output_target);
  local_620 = (string *)(words[3].field_2._M_local_buf + 8);
  do {
    local_620 = local_620 + -0x20;
    std::__cxx11::string::~string(local_620);
  } while (local_620 != (string *)local_198);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string((string *)&d1.output_target);
  std::__cxx11::string::~string((string *)&e1.output_target);
  std::__cxx11::string::~string((string *)local_30);
  return brand.field_2._12_4_;
}

Assistant:

int main() {
	// Example 1
	// Encode
	std::string brand = "YukiWorkshop";
	std::string out1;
	Base64X::Encoder<std::string> e1;
	e1 >> out1;
	e1 << brand << " " << "Rocks!" << nullptr;
	std::cout << out1 << "\n";

	// Decode
	std::string dout1;
	Base64X::Decoder<std::string> d1;
	d1 >> dout1;
	d1 << out1;
	std::cout << dout1 << "\n";


	// Example 2
	// Encode
	std::string buf = "Austin!";
	std::vector<uint8_t> v(buf.begin(), buf.end());
	std::string words[4] = { "Hey ", "guys, ", "this is "};
	std::string out2;
	Base64X::Encoder<std::string> e2;
	for (auto &word : words) {
		out2 += e2.encode(word);
	}
	out2 += e2.encode(v);
	out2 += e2.finalize();
	std::cout << out2 << "\n";

	// Decode
	Base64X::Decoder<std::string> d2;
	for (auto &it : out2) {
		std::string c;
		c.push_back(it);
		std::cout << d2.decode(c);
	}
	std::cout << "\n";

	// Example 3
	// Encode
	std::string buf0 = "roses are red";
	std::vector<uint8_t> buf1(buf0.begin(), buf0.end());
	auto out3 = Base64X::encode(buf1).as<std::string>();
	std::cout << out3 << "\n";

	auto out4 = Base64X::encode("violets are blue").as<std::vector<uint8_t>>();
	fwrite(out4.data(), 1, out4.size(), stdout);
	fputc('\n', stdout);

	// Decode
	auto dout3 = Base64X::decode(out3).as<std::string>();
	std::cout << dout3 << "\n";
	auto dout4 = Base64X::decode(out4).as<std::vector<uint8_t>>();
	fwrite(dout4.data(), 1, dout4.size(), stdout);
	fputc('\n', stdout);


	// Example 4
	// Encode
	std::vector<double> buf2 = {3.14159265357, 42.42, 233.233, 666.666};
	auto out5 = Base64X::encode(buf2).as<std::vector<uint8_t>>();
	fwrite(out5.data(), 1, out5.size(), stdout);
	fputc('\n', stdout);

	// Decode
	auto dout5 = Base64X::decode(out5).as_vector<double>();
	for (auto &it : dout5) {
		std::cout << it << " ";
	}
	std::cout << "\n";


}